

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath __thiscall testing::internal::FilePath::RemoveFileName(FilePath *this)

{
  char *__s;
  char *pcVar1;
  char *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  undefined8 *in_RSI;
  FilePath FVar3;
  String dir;
  String local_48;
  String local_30;
  
  __s = (char *)*in_RSI;
  pcVar1 = strrchr(__s,0x2f);
  local_48.c_str_ = (char *)0x0;
  local_48.length_ = 0;
  if (pcVar1 == (char *)0x0) {
    String::operator=(&local_48,"./");
  }
  else {
    __dest = (char *)operator_new__((ulong)(pcVar1 + (2 - (long)__s)));
    pcVar1 = pcVar1 + (1 - (long)__s);
    memcpy(__dest,__s,(size_t)pcVar1);
    __dest[(long)pcVar1] = '\0';
    local_30.c_str_ = __dest;
    local_30.length_ = (size_t)pcVar1;
    String::operator=(&local_48,&local_30);
    if (local_30.c_str_ != (char *)0x0) {
      operator_delete__(local_30.c_str_);
    }
  }
  FilePath(this,&local_48);
  sVar2 = extraout_RDX;
  if (local_48.c_str_ != (char *)0x0) {
    operator_delete__(local_48.c_str_);
    sVar2 = extraout_RDX_00;
  }
  FVar3.pathname_.length_ = sVar2;
  FVar3.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar3.pathname_;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  String dir;
  if (last_sep) {
    dir = String(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}